

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Swap_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Type type;
  key_type kVar2;
  hasher *hf;
  Hasher HVar3;
  int i_2;
  TypeParam empty_ht;
  int i_1;
  TypeParam swap_to_clear_ht;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_buckets;
  int i;
  TypeParam other_ht;
  hasher hasher;
  value_type in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff560;
  undefined4 in_stack_fffffffffffff564;
  value_type in_stack_fffffffffffff568;
  int index;
  undefined4 in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff574;
  key_equal *in_stack_fffffffffffff578;
  hasher *in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff588;
  Type in_stack_fffffffffffff58c;
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff5e0;
  int local_7e8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_7e0 [13];
  value_type local_710;
  int local_708;
  key_type local_704;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_700 [11];
  Type local_644;
  hasher *local_640;
  undefined4 local_634;
  AssertionResult local_630 [2];
  key_type local_60c;
  size_type local_608;
  undefined4 local_5fc;
  AssertionResult local_5f8 [2];
  size_type local_5d8;
  undefined4 local_5cc;
  AssertionResult local_5c8 [2];
  size_type local_5a8;
  undefined4 local_59c;
  AssertionResult local_598 [2];
  Hasher local_578;
  Hasher local_568;
  int local_558;
  undefined4 local_554;
  AssertionResult local_550 [2];
  Hasher local_530;
  Hasher local_520;
  int local_510;
  undefined4 local_50c;
  AssertionResult local_508 [2];
  key_type local_4e8;
  key_type local_4e4;
  AssertionResult local_4e0 [2];
  key_type local_4c0;
  key_type local_4bc;
  AssertionResult local_4b8 [2];
  key_type local_494;
  size_type local_490;
  undefined4 local_484;
  AssertionResult local_480 [2];
  key_type local_45c;
  size_type local_458;
  undefined4 local_44c;
  AssertionResult local_448 [2];
  key_type local_424;
  size_type local_420;
  undefined4 local_414;
  AssertionResult local_410 [2];
  key_type local_3ec;
  size_type local_3e8;
  undefined4 local_3dc;
  AssertionResult local_3d8 [2];
  key_type local_3b4;
  size_type local_3b0;
  undefined4 local_3a4;
  AssertionResult local_3a0 [2];
  key_type local_37c;
  size_type local_378;
  undefined4 local_36c;
  AssertionResult local_368 [2];
  size_type local_348;
  undefined4 local_33c;
  AssertionResult local_338 [2];
  size_type local_318;
  undefined4 local_30c;
  AssertionResult local_308 [2];
  undefined4 local_2e4;
  size_type local_2e0;
  AssertionResult local_2d8 [2];
  size_type local_2b8;
  AssertionResult local_2b0 [2];
  Hasher local_290;
  Hasher local_280;
  int local_270;
  undefined4 local_26c;
  AssertionResult local_268 [2];
  Hasher local_248;
  Hasher local_238;
  int local_228;
  undefined4 local_224;
  AssertionResult local_220 [2];
  Hasher local_200;
  Hasher local_1f0;
  int local_1e0;
  undefined4 local_1dc;
  AssertionResult local_1d8 [2];
  Hasher local_1b8;
  Hasher local_1a8;
  int local_198;
  undefined4 local_194;
  AssertionResult local_190 [2];
  key_type local_170;
  key_type local_16c;
  AssertionResult local_168 [2];
  key_type local_148;
  key_type local_144;
  AssertionResult local_140;
  size_type local_130;
  value_type local_fc;
  key_type local_f4;
  value_type local_c8;
  int local_c0;
  key_type local_bc;
  key_type local_b8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_a8 [10];
  
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_a8,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588)
             ,in_stack_fffffffffffff580,in_stack_fffffffffffff578,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_a8);
  local_b8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  local_bc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_c0 = 3; local_c0 < 2000; local_c0 = local_c0 + 1) {
    local_c8 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffff558,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff5e0,
             (value_type *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  }
  local_f4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                         in_stack_fffffffffffff568.second);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
          (key_type *)in_stack_fffffffffffff558);
  local_fc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffff558,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff5e0,
           (value_type *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
  local_130 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbd637b);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff558);
  local_144 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_148 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd63ea);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd6462);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd64c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd6536);
  local_16c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_170 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd656c);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd65f6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd6659);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd66ca);
  local_194 = 1;
  local_1b8 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570))
  ;
  local_1a8 = local_1b8;
  local_198 = Hasher::id(&local_1a8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_190);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd67ba);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd681d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd688e);
  local_1dc = 0;
  local_200 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570))
  ;
  local_1f0 = local_200;
  local_1e0 = Hasher::id(&local_1f0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd697a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd69dd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd6a4e);
  local_224 = 1;
  local_248 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_238 = local_248;
  local_228 = Hasher::id(&local_238);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_220);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd6b3e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd6ba1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd6c12);
  local_26c = 0;
  local_290 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_280 = local_290;
  local_270 = Hasher::id(&local_280);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd6cfe);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd6d61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd6dcf);
  local_2b8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbd6de0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (unsigned_long *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd6e6d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd6ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd6f41);
  local_2e0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xbd6f4e);
  local_2e4 = 200;
  testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (unsigned_long *)in_stack_fffffffffffff568,
             (uint *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd6fe6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd7049);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd70ba);
  local_30c = 1;
  local_318 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd70d6);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_308);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd7163);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd71c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7237);
  local_33c = 0x7cc;
  local_348 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd724f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_338);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd72dc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd733f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd73b0);
  local_36c = 0;
  local_37c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_378 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_368);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd7495);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd74f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7569);
  local_3a4 = 1;
  local_3b4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_3b0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd763f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd76a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7713);
  local_3dc = 1;
  local_3ec = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_3e8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd77f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd785b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd78cc);
  local_414 = 0;
  local_424 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_420 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd79a2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd7a05);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7a76);
  local_44c = 0;
  local_45c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_458 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_448);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd7b5b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd7bbe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7c2f);
  local_484 = 0;
  local_494 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_490 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_480);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd7d05);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd7d68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7dd9);
  google::
  swap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffff558);
  local_4bc = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd7e2e);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd7eb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd7f1b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd7f8c);
  local_4e4 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_4e8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xbd7fc2);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_4e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd804c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd80af);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd8120);
  local_50c = 0;
  local_530 = (Hasher)google::
                      BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570))
  ;
  local_520 = local_530;
  local_510 = Hasher::id(&local_520);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_508);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd8210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff5e0,
               (Message *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd8273);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd82e4);
  local_554 = 1;
  HVar3 = (Hasher)google::
                  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ::hash_funct((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  local_578 = HVar3;
  local_568 = HVar3;
  local_558 = Hasher::id(&local_568);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (int *)in_stack_fffffffffffff568,
             (int *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_550);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd83d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd842d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd849e);
  local_59c = 0x7cc;
  local_5a8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd84ba);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_598);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd8541);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd859e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd860c);
  local_5cc = 1;
  local_5d8 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xbd8624);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    testing::AssertionResult::failure_message((AssertionResult *)0xbd86ab);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd8708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd8779);
  local_5fc = 1;
  local_60c = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                           *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                          in_stack_fffffffffffff568.second);
  local_608 = google::
              BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                      (key_type *)in_stack_fffffffffffff558);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    in_stack_fffffffffffff590 =
         (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xbd884c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,in_stack_fffffffffffff58c,
               (char *)in_stack_fffffffffffff580,(int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd88a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd891a);
  local_634 = 0;
  type = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                     in_stack_fffffffffffff568.second);
  local_644 = type;
  hf = (hasher *)
       google::
       BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
       ::count((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
               (key_type *)in_stack_fffffffffffff558);
  local_640 = hf;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff578,
             (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
             (uint *)in_stack_fffffffffffff568,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_630);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff590);
    in_stack_fffffffffffff578 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xbd89e4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff590,type,(char *)hf,
               (int)((ulong)in_stack_fffffffffffff578 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
    testing::internal::AssertHelper::operator=
              (HVar3._0_8_,(Message *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560));
    testing::Message::~Message((Message *)0xbd8a41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd8ab2);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558.second);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_700,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(type,in_stack_fffffffffffff588),hf,
             in_stack_fffffffffffff578,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_700);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570),
                      in_stack_fffffffffffff568.second);
  local_704 = kVar2;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_708 = 2; index = in_stack_fffffffffffff568.second, local_708 < 10000;
      local_708 = local_708 + 1) {
    in_stack_fffffffffffff568 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff558,0);
    local_710 = in_stack_fffffffffffff568;
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(HVar3._0_8_,(value_type *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
  }
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558.second);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
             in_stack_fffffffffffff558.second);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_7e0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            (in_stack_fffffffffffff590,CONCAT44(type,in_stack_fffffffffffff588),hf,
             in_stack_fffffffffffff578,(allocator_type *)CONCAT44(kVar2,in_stack_fffffffffffff570));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_7e0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffff564,in_stack_fffffffffffff560),
         (BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)in_stack_fffffffffffff558);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)CONCAT44(kVar2,in_stack_fffffffffffff570),index);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(kVar2,in_stack_fffffffffffff560),
                    (key_type *)in_stack_fffffffffffff558);
  for (local_7e8 = 2; local_7e8 < 10000; local_7e8 = local_7e8 + 1) {
    in_stack_fffffffffffff558 =
         HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff558,0);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(HVar3._0_8_,(value_type *)CONCAT44(HVar3.num_compares_,in_stack_fffffffffffff5d8));
  }
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd8da9);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd8db6);
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xbd8dc3);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Swap) {
  // Let's make a second hashtable with its own hasher, key_equal, etc.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  TypeParam other_ht(200, hasher, hasher);

  this->ht_.set_deleted_key(this->UniqueKey(1));
  other_ht.set_deleted_key(this->UniqueKey(2));

  for (int i = 3; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  this->ht_.erase(this->UniqueKey(1000));
  other_ht.insert(this->UniqueObject(2001));
  typename TypeParam::size_type expected_buckets = other_ht.bucket_count();

  this->ht_.swap(other_ht);

  EXPECT_EQ(this->UniqueKey(2), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(1), other_ht.deleted_key());

  EXPECT_EQ(1, this->ht_.hash_funct().id());
  EXPECT_EQ(0, other_ht.hash_funct().id());

  EXPECT_EQ(1, this->ht_.key_eq().id());
  EXPECT_EQ(0, other_ht.key_eq().id());

  EXPECT_EQ(expected_buckets, this->ht_.bucket_count());
  EXPECT_GT(other_ht.bucket_count(), 200u);

  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(1996u, other_ht.size());  // because we erased 1000

  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, other_ht.count(this->UniqueKey(111)));
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(2001)));
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1000)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(1000)));

// We purposefully don't swap allocs -- they're not necessarily swappable.

// Now swap back, using the free-function swap
// NOTE: MSVC seems to have trouble with this free swap, not quite
// sure why.  I've given up trying to fix it though.
#ifdef _MSC_VER
  other_ht.swap(this->ht_);
#else
  swap(this->ht_, other_ht);
#endif

  EXPECT_EQ(this->UniqueKey(1), this->ht_.deleted_key());
  EXPECT_EQ(this->UniqueKey(2), other_ht.deleted_key());
  EXPECT_EQ(0, this->ht_.hash_funct().id());
  EXPECT_EQ(1, other_ht.hash_funct().id());
  EXPECT_EQ(1996u, this->ht_.size());
  EXPECT_EQ(1u, other_ht.size());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(111)));
  EXPECT_EQ(0u, other_ht.count(this->UniqueKey(111)));

  // A user reported a crash with this code using swap to clear.
  // We've since fixed the bug; this prevents a regression.
  TypeParam swap_to_clear_ht;
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
  TypeParam empty_ht;
  empty_ht.swap(swap_to_clear_ht);
  swap_to_clear_ht.set_deleted_key(this->UniqueKey(1));
  for (int i = 2; i < 10000; ++i) {
    swap_to_clear_ht.insert(this->UniqueObject(i));
  }
}